

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraint.cpp
# Opt level: O0

void __thiscall
btMultiBodyConstraint::btMultiBodyConstraint
          (btMultiBodyConstraint *this,btMultiBody *bodyA,btMultiBody *bodyB,int linkA,int linkB,
          int numRows,bool isUnilateral)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  
  *in_RDI = &PTR__btMultiBodyConstraint_002e8088;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  *(undefined4 *)(in_RDI + 3) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x1c) = in_R8D;
  *(undefined4 *)(in_RDI + 4) = in_R9D;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(byte *)(in_RDI + 6) = (byte)linkB & 1;
  *(undefined4 *)((long)in_RDI + 0x34) = 0xffffffff;
  *(undefined4 *)(in_RDI + 7) = 0x42c80000;
  btAlignedObjectArray<float>::btAlignedObjectArray
            ((btAlignedObjectArray<float> *)CONCAT44(in_ECX,in_R8D));
  return;
}

Assistant:

btMultiBodyConstraint::btMultiBodyConstraint(btMultiBody* bodyA,btMultiBody* bodyB,int linkA, int linkB, int numRows, bool isUnilateral)
	:m_bodyA(bodyA),
	m_bodyB(bodyB),
	m_linkA(linkA),
	m_linkB(linkB),
	m_numRows(numRows),
	m_jacSizeA(0),
	m_jacSizeBoth(0),
	m_isUnilateral(isUnilateral),
	m_numDofsFinalized(-1),
	m_maxAppliedImpulse(100)
{

}